

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::~Value(Value *this)

{
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  CommentInfo *pCVar1;
  char *pcVar2;
  CommentInfo *this_01;
  uint uVar3;
  Value *this_local;
  
  uVar3 = (uint)(ushort)(byte)this->field_0x8;
  if (3 < (byte)this->field_0x8) {
    if (uVar3 == 4) {
      if ((short)(*(short *)&this->field_0x8 << 7) < 0) {
        releaseStringValue((this->value_).string_);
      }
    }
    else if (uVar3 != 5) {
      if (1 < uVar3 - 6) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/jsoncpp/src/lib_json/json_value.cpp"
                      ,0x214,"Json::Value::~Value()");
      }
      this_00 = (this->value_).map_;
      if (this_00 !=
          (map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x0) {
        std::
        map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::~map(this_00);
        operator_delete(this_00,0x30);
      }
    }
  }
  if ((this->comments_ != (CommentInfo *)0x0) &&
     (pCVar1 = this->comments_, pCVar1 != (CommentInfo *)0x0)) {
    pcVar2 = pCVar1[-1].comment_;
    this_01 = pCVar1 + (long)pcVar2;
    while (pCVar1 != this_01) {
      this_01 = this_01 + -1;
      CommentInfo::~CommentInfo(this_01);
    }
    operator_delete__(pCVar1 + -1,(long)pcVar2 * 8 + 8);
  }
  return;
}

Assistant:

Value::~Value()
{
   switch ( type_ )
   {
   case nullValue:
   case intValue:
   case uintValue:
   case realValue:
   case booleanValue:
      break;
   case stringValue:
      if ( allocated_ )
         releaseStringValue( value_.string_ );
      break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
   case arrayValue:
   case objectValue:
      delete value_.map_;
      break;
#else
   case arrayValue:
      arrayAllocator()->destructArray( value_.array_ );
      break;
   case objectValue:
      mapAllocator()->destructMap( value_.map_ );
      break;
#endif
   default:
      JSON_ASSERT_UNREACHABLE;
   }

   if ( comments_ )
      delete[] comments_;
}